

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall ccs::CcsDomain::CcsDomain(CcsDomain *this,bool logAccesses)

{
  DagBuilder *this_00;
  shared_ptr<ccs::CcsLogger> local_38;
  shared_ptr<ccs::CcsTracer> local_28;
  byte local_11;
  CcsDomain *pCStack_10;
  bool logAccesses_local;
  CcsDomain *this_local;
  
  local_11 = logAccesses;
  pCStack_10 = this;
  this_00 = (DagBuilder *)operator_new(0x28);
  CcsLogger::makeStdErrLogger();
  CcsTracer::makeLoggingTracer((CcsTracer *)&local_28,&local_38,(bool)(local_11 & 1));
  DagBuilder::DagBuilder(this_00,&local_28);
  std::unique_ptr<ccs::DagBuilder,std::default_delete<ccs::DagBuilder>>::
  unique_ptr<std::default_delete<ccs::DagBuilder>,void>
            ((unique_ptr<ccs::DagBuilder,std::default_delete<ccs::DagBuilder>> *)this,this_00);
  std::shared_ptr<ccs::CcsTracer>::~shared_ptr(&local_28);
  std::shared_ptr<ccs::CcsLogger>::~shared_ptr(&local_38);
  return;
}

Assistant:

CcsDomain::CcsDomain(bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    CcsLogger::makeStdErrLogger(), logAccesses))) {}